

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LinearConHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLinearConExpr
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int con_index,
          int num_linear_terms)

{
  LinearConBuilder LVar1;
  MutAlgebraicCon MVar2;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  MVar2 = BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  LVar1 = BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_linear_expr
                    ((MutAlgebraicCon *)
                     MVar2.
                     super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_,in_stack_ffffffffffffffd4);
  return (LinearConHandler)LVar1.expr_;
}

Assistant:

LinearConHandler OnLinearConExpr(int con_index, int num_linear_terms) {
    return builder_.algebraic_con(con_index).set_linear_expr(num_linear_terms);
  }